

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O3

Grammar * __thiscall
xercesc_4_0::XMLGrammarPoolImpl::orphanGrammar(XMLGrammarPoolImpl *this,XMLCh *nameSpaceKey)

{
  int iVar1;
  Grammar *pGVar2;
  
  if (this->fLocked == false) {
    pGVar2 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                       (this->fGrammarRegistry,nameSpaceKey);
    if ((pGVar2 != (Grammar *)0x0) && (this->fXSModelIsValid != false)) {
      iVar1 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[5])(pGVar2);
      if (iVar1 == 1) {
        this->fXSModelIsValid = false;
      }
    }
  }
  else {
    pGVar2 = (Grammar *)0x0;
  }
  return pGVar2;
}

Assistant:

Grammar* XMLGrammarPoolImpl::orphanGrammar(const XMLCh* const nameSpaceKey)
{
    if (!fLocked)
    {
        Grammar* grammar = fGrammarRegistry->orphanKey(nameSpaceKey);
        if (fXSModelIsValid && grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType)
        {
            fXSModelIsValid = false;
        }
        return grammar;
    }
    return 0;
}